

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::createGroupVariableOrder(CppGenerator *this)

{
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar1;
  pointer *this_00;
  pointer pbVar2;
  pointer pvVar3;
  pointer pvVar4;
  TreeDecomposition *pTVar5;
  Aggregate *pAVar6;
  pointer ppVar7;
  iterator iVar8;
  pointer pbVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  pointer puVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  size_t sVar20;
  View *pVVar21;
  TDNode *pTVar22;
  TDNode *pTVar23;
  pointer ppAVar24;
  ulong uVar25;
  size_t sVar26;
  pointer puVar27;
  bool *__s;
  size_t var;
  size_t *psVar28;
  ulong uVar29;
  CppGenerator *pCVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  var_bitset joinVars;
  vector<bool,_std::allocator<bool>_> incViewBitset;
  unsigned_long local_e0;
  allocator_type local_d1;
  CppGenerator *local_d0;
  undefined1 local_c8 [16];
  ulong local_b8;
  ulong uStack_b0;
  long local_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  ulong local_68;
  size_t *local_60;
  size_t *local_58;
  View *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  computeViewOrdering(this);
  pvVar3 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar32 = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar32;
  uVar17 = SUB168(auVar12 * ZEXT816(0x18),0);
  uVar29 = uVar17 + 8;
  if (0xfffffffffffffff7 < uVar17) {
    uVar29 = 0xffffffffffffffff;
  }
  if (SUB168(auVar12 * ZEXT816(0x18),8) != 0) {
    uVar29 = 0xffffffffffffffff;
  }
  local_d0 = this;
  puVar18 = (ulong *)operator_new__(uVar29);
  *puVar18 = uVar32;
  if (pvVar4 != pvVar3) {
    lVar19 = 0;
    do {
      *(undefined1 (*) [16])
       ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar18 + 1))->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar19) = (undefined1  [16])0x0;
      *(undefined8 *)((long)puVar18 + lVar19 + 0x18) = 0;
      lVar19 = lVar19 + 0x18;
    } while ((long)pvVar4 - (long)pvVar3 != lVar19);
  }
  local_d0->groupVariableOrder =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar18 + 1);
  puVar18 = (ulong *)operator_new__(uVar29);
  *puVar18 = uVar32;
  if (pvVar4 != pvVar3) {
    lVar19 = 0;
    do {
      *(undefined1 (*) [16])
       ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar18 + 1))->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar19) = (undefined1  [16])0x0;
      *(undefined8 *)((long)puVar18 + lVar19 + 0x18) = 0;
      lVar19 = lVar19 + 0x18;
    } while ((long)pvVar4 - (long)pvVar3 != lVar19);
  }
  local_d0->groupIncomingViews =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar18 + 1);
  puVar18 = (ulong *)operator_new__(uVar29);
  *puVar18 = uVar32;
  if ((long)pvVar4 - (long)pvVar3 != 0) {
    memset((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar18 + 1),0,
           ((((long)pvVar4 - (long)pvVar3) - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  pCVar30 = local_d0;
  local_d0->groupViewsPerVarInfo =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar18 + 1);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (&local_d0->groupVariableOrderBitset,uVar32);
  if ((pCVar30->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pCVar30->viewGroups).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      local_c8 = (undefined1  [16])0x0;
      sVar20 = QueryCompiler::numberOfViews
                         ((pCVar30->_qc).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_e0 = local_e0 & 0xffffffffffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_98,sVar20,(bool *)&local_e0,&local_d1)
      ;
      pTVar5 = (pCVar30->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_68 = uVar17;
      pVVar21 = QueryCompiler::getView
                          ((pCVar30->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           *(pCVar30->viewGroups).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar17].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      pTVar22 = TreeDecomposition::getRelation(pTVar5,(ulong)pVVar21->_origin);
      pTVar5 = (pCVar30->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_a0 = uVar17 * 3;
      pVVar21 = QueryCompiler::getView
                          ((pCVar30->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           *(pCVar30->viewGroups).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar17].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      pTVar23 = TreeDecomposition::getRelation(pTVar5,(ulong)pVVar21->_destination);
      if (pTVar22->_id != pTVar23->_id) {
        local_c8._8_8_ =
             (pTVar22->_bag).super__Base_bitset<2UL>._M_w[1] &
             (pTVar23->_bag).super__Base_bitset<2UL>._M_w[1] | local_c8._8_8_;
        local_c8._0_8_ =
             (pTVar22->_bag).super__Base_bitset<2UL>._M_w[0] &
             (pTVar23->_bag).super__Base_bitset<2UL>._M_w[0] | local_c8._0_8_;
      }
      pvVar3 = (pCVar30->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar28 = *(size_t **)
                 ((long)&(pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data + local_a0 * 8);
      local_60 = *(size_t **)
                  ((long)&(pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data + local_a0 * 8 + 8);
      if (psVar28 != local_60) {
        local_b8 = local_c8._0_8_;
        uStack_b0 = local_c8._8_8_;
        do {
          pVVar21 = QueryCompiler::getView
                              ((pCVar30->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               *psVar28);
          pTVar23 = TreeDecomposition::getRelation
                              ((pCVar30->_td).
                               super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(ulong)pVVar21->_destination);
          if (pVVar21->_origin == pVVar21->_destination) {
            sVar20 = pTVar22->_numOfNeighbors;
          }
          else {
            sVar20 = pTVar22->_numOfNeighbors - 1;
          }
          local_58 = psVar28;
          if (sVar20 == 0) {
            local_b8 = local_b8 |
                       (pTVar23->_bag).super__Base_bitset<2UL>._M_w[0] &
                       (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[0];
            uStack_b0 = uStack_b0 |
                        (pTVar23->_bag).super__Base_bitset<2UL>._M_w[1] &
                        (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[1];
          }
          else {
            ppAVar24 = (pVVar21->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if ((pVVar21->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                ._M_impl.super__Vector_impl_data._M_finish != ppAVar24) {
              uVar17 = 0;
              local_50 = pVVar21;
              do {
                pAVar6 = ppAVar24[uVar17];
                local_48 = uVar17;
                if ((pAVar6->_agg).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    (pAVar6->_agg).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar19 = 0;
                  uVar17 = 0;
                  do {
                    lVar33 = lVar19 << 4;
                    lVar31 = 0;
                    local_40 = uVar17;
                    local_38 = lVar19;
                    do {
                      ppVar7 = (pAVar6->_incoming).
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      pVVar21 = QueryCompiler::getView
                                          ((local_d0->_qc).
                                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr,*(size_t *)((long)&ppVar7->first + lVar33));
                      uVar29 = (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[0];
                      uVar32 = (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[1];
                      uVar17 = *(ulong *)((long)&ppVar7->first + lVar33);
                      uVar25 = uVar17 + 0x3f;
                      if (-1 < (long)uVar17) {
                        uVar25 = uVar17;
                      }
                      uVar13 = (pTVar22->_bag).super__Base_bitset<2UL>._M_w[0];
                      uVar14 = (pTVar22->_bag).super__Base_bitset<2UL>._M_w[1];
                      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar25 >> 6) +
                       ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                           local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar25 >> 6) +
                            ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                           1L << ((byte)uVar17 & 0x3f);
                      local_b8 = local_b8 | uVar13 & uVar29;
                      uStack_b0 = uStack_b0 | uVar14 & uVar32;
                      lVar31 = lVar31 + -1;
                      lVar33 = lVar33 + 0x10;
                    } while (-lVar31 != sVar20);
                    uVar17 = local_40 + 1;
                    lVar19 = local_38 - lVar31;
                  } while (uVar17 < (ulong)(((long)(pAVar6->_agg).
                                                                                                      
                                                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(pAVar6->_agg).
                                                                                                      
                                                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 6) *
                                           -0x5555555555555555));
                }
                uVar17 = local_48 + 1;
                ppAVar24 = (local_50->_aggregates).
                           super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
              } while (uVar17 < (ulong)((long)(local_50->_aggregates).
                                              super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppAVar24 >> 3));
            }
          }
          psVar28 = local_58 + 1;
          pCVar30 = local_d0;
        } while (psVar28 != local_60);
        local_c8._8_8_ = uStack_b0;
        local_c8._0_8_ = local_b8;
      }
      uVar17 = local_68;
      lVar19 = local_a0;
      local_e0 = 0;
      do {
        if ((*(ulong *)(local_c8 + (local_e0 >> 6) * 8) >> (local_e0 & 0x3f) & 1) != 0) {
          pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   (&(pCVar30->groupVariableOrder->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar19);
          iVar8._M_current = *(unsigned_long **)(pvVar1 + 8);
          if (iVar8._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar8,&local_e0);
          }
          else {
            *iVar8._M_current = local_e0;
            *(unsigned_long **)(pvVar1 + 8) = iVar8._M_current + 1;
          }
        }
        local_e0 = local_e0 + 1;
      } while (local_e0 < 100);
      if ((long)(pCVar30->viewGroups).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pCVar30->viewGroups).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x18) {
        this_00 = &(pCVar30->groupVariableOrder->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar19;
        local_e0 = 0;
        iVar8._M_current = this_00[1];
        if (iVar8._M_current == this_00[2]) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,iVar8,
                     &local_e0);
        }
        else {
          *iVar8._M_current = 0;
          this_00[1] = iVar8._M_current + 1;
        }
      }
      pbVar9 = (pCVar30->groupVariableOrderBitset).
               super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar2 = pbVar9 + uVar17;
      uVar29 = (pbVar2->super__Base_bitset<2UL>)._M_w[1];
      pbVar9 = pbVar9 + uVar17;
      (pbVar9->super__Base_bitset<2UL>)._M_w[0] =
           (pbVar2->super__Base_bitset<2UL>)._M_w[0] | local_c8._0_8_;
      (pbVar9->super__Base_bitset<2UL>)._M_w[1] = uVar29 | local_c8._8_8_;
      pvVar10 = pCVar30->groupViewsPerVarInfo;
      puVar27 = (&(pCVar30->groupVariableOrder->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start)[lVar19];
      puVar11 = (&(pCVar30->groupVariableOrder->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish)[lVar19];
      sVar20 = QueryCompiler::numberOfViews
                         ((pCVar30->_qc).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      lVar19 = local_a0;
      local_e0 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (&(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + local_a0),
                 (sVar20 + 2) * ((long)puVar11 - (long)puVar27 >> 3),&local_e0);
      puVar27 = (&(pCVar30->groupVariableOrder->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start)[lVar19];
      if ((&(pCVar30->groupVariableOrder->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish)[lVar19] != puVar27) {
        uVar17 = 0;
        do {
          if (((pTVar22->_bag).super__Base_bitset<2UL>._M_w[puVar27[uVar17] >> 6] >>
               (puVar27[uVar17] & 0x3f) & 1) != 0) {
            sVar20 = QueryCompiler::numberOfViews
                               ((pCVar30->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            puVar27 = (&(pCVar30->groupViewsPerVarInfo->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start)[lVar19];
            sVar26 = QueryCompiler::numberOfViews
                               ((pCVar30->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            lVar31 = (sVar20 + 2) * uVar17;
            (&(pCVar30->groupViewsPerVarInfo->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start)[lVar19][lVar31 + 1] = sVar26;
            puVar27 = puVar27 + lVar31;
            *puVar27 = *puVar27 + 1;
          }
          uVar17 = uVar17 + 1;
          puVar27 = (&(pCVar30->groupVariableOrder->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start)[lVar19];
        } while (uVar17 < (ulong)((long)(&(pCVar30->groupVariableOrder->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish)[lVar19] -
                                  (long)puVar27 >> 3));
      }
      uVar17 = local_68;
      uVar29 = 0;
      while (local_e0 = uVar29,
            sVar20 = QueryCompiler::numberOfViews
                               ((pCVar30->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               ), uVar29 < sVar20) {
        uVar29 = local_e0 + 0x3f;
        if (-1 < (long)local_e0) {
          uVar29 = local_e0;
        }
        if ((local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar29 >> 6) +
              ((ulong)((local_e0 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
             (local_e0 & 0x3f) & 1) != 0) {
          pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   (&(pCVar30->groupIncomingViews->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar19);
          iVar8._M_current = *(unsigned_long **)(pvVar1 + 8);
          if (iVar8._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar8,&local_e0);
          }
          else {
            *iVar8._M_current = local_e0;
            *(unsigned_long **)(pvVar1 + 8) = iVar8._M_current + 1;
          }
          pVVar21 = QueryCompiler::getView
                              ((pCVar30->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               local_e0);
          puVar27 = (&(pCVar30->groupVariableOrder->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start)[lVar19];
          if ((&(pCVar30->groupVariableOrder->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish)[lVar19] != puVar27) {
            uVar29 = 0;
            do {
              if (((pVVar21->_fVars).super__Base_bitset<2UL>._M_w[puVar27[uVar29] >> 6] >>
                   (puVar27[uVar29] & 0x3f) & 1) != 0) {
                sVar20 = QueryCompiler::numberOfViews
                                   ((pCVar30->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
                puVar27 = (&(pCVar30->groupViewsPerVarInfo->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start)[lVar19] +
                          (sVar20 + 2) * uVar29;
                puVar27[*puVar27 + 1] = local_e0;
                *puVar27 = *puVar27 + 1;
              }
              uVar29 = uVar29 + 1;
              puVar27 = (&(pCVar30->groupVariableOrder->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start)[lVar19];
            } while (uVar29 < (ulong)((long)(&(pCVar30->groupVariableOrder->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl.super__Vector_impl_data._M_finish)[lVar19] -
                                      (long)puVar27 >> 3));
          }
        }
        uVar29 = local_e0 + 1;
      }
      if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ =
             local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)(((long)(pCVar30->viewGroups).
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar30->viewGroups).
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  sVar20 = QueryCompiler::numberOfViews
                     ((pCVar30->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  __s = (bool *)operator_new__(sVar20);
  memset(__s,0,sVar20);
  pCVar30->_requireHashing = __s;
  sVar20 = QueryCompiler::numberOfViews
                     ((pCVar30->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  if (sVar20 != 0) {
    sVar20 = 0;
    do {
      pVVar21 = QueryCompiler::getView
                          ((pCVar30->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           sVar20);
      pTVar22 = TreeDecomposition::getRelation
                          ((pCVar30->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (ulong)pVVar21->_origin);
      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((pTVar22->_bag).super__Base_bitset<2UL>._M_w[0] &
           (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[0]);
      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._8_8_ =
           (pTVar22->_bag).super__Base_bitset<2UL>._M_w[1] &
           (pVVar21->_fVars).super__Base_bitset<2UL>._M_w[1];
      uVar17 = 0;
      lVar19 = 0;
      do {
        if ((*(ulong *)((long)&local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (uVar17 >> 6) * 8) >> (uVar17 & 0x3f) & 1) != 0) {
          if (uVar17 != pCVar30->sortOrders[pVVar21->_origin][lVar19]) {
            bVar16 = true;
            goto LAB_001f2b1c;
          }
          lVar19 = lVar19 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 100);
      bVar16 = true;
      if (((pVVar21->_fVars).super__Base_bitset<2UL>._M_w[0] &
          ((ulong)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ^
          0xffffffffffffffff)) == 0) {
        bVar15 = true;
        do {
          bVar16 = bVar15;
          if (!bVar16) break;
          bVar15 = false;
        } while (((pVVar21->_fVars).super__Base_bitset<2UL>._M_w[1] &
                 (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ ^
                 0xffffffffffffffff) & (ulong)DAT_002b26a0) == 0);
      }
LAB_001f2b1c:
      pCVar30->_requireHashing[sVar20] = bVar16;
      sVar20 = sVar20 + 1;
      sVar26 = QueryCompiler::numberOfViews
                         ((pCVar30->_qc).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (sVar20 < sVar26);
  }
  return;
}

Assistant:

void CppGenerator::createGroupVariableOrder()
{
    computeViewOrdering();
    
    groupVariableOrder = new std::vector<size_t>[viewGroups.size()]();
    groupIncomingViews = new std::vector<size_t>[viewGroups.size()]();
    groupViewsPerVarInfo = new std::vector<size_t>[viewGroups.size()];

    groupVariableOrderBitset.resize(viewGroups.size());
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
    {
        var_bitset joinVars;
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        
        TDNode* baseRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_origin);

        // TODO:TODO: is it ok to add this in ?!??
        // we are adding the variables in the intersection with the destination
        TDNode* destRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_destination);

        if (baseRelation->_id != destRelation->_id)
            joinVars |= destRelation->_bag & baseRelation->_bag;

        for (const size_t& viewID : viewGroups[group])
        {
            View* view = _qc->getView(viewID);

            TDNode* destRelation = _td->getRelation(view->_destination);

            size_t numberIncomingViews =
                (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
                 baseRelation->_numOfNeighbors - 1);

            // if ther are not inc views we use the fVars as free variable
            if (numberIncomingViews == 0)
                joinVars |= (view->_fVars & destRelation->_bag);
            else
            {
                for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
                {
                    Aggregate* aggregate = view->_aggregates[aggNo];

                    size_t incOffset = 0;
                    // First find the all views that contribute to this Aggregate
                    for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                    {
                        for (size_t j = 0; j < numberIncomingViews; j++)
                        {
                            const size_t& incViewID =
                                aggregate->_incoming[incOffset].first;


                            // TODO: TODO: TODO: MAKE SURE THAT YOU ALSO
                            // CONSIDER INTERSECTION OF FREE VARS THAT ARE
                            // SHARED B/W TWO VIEWS BUT NOT IN BAG
                            
                            // Add the intersection of the view and the base
                            // relation to joinVars
                            joinVars |= (_qc->getView(incViewID)->_fVars &
                                         baseRelation->_bag);
                            // Indicate that this view contributes to some aggregate
                            incViewBitset[incViewID] = 1;
                            ++incOffset;
                        }                        
                    }
                }
            }
        }

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            if (joinVars[var])
                groupVariableOrder[group].push_back(var);

        if(viewGroups.size() == 1) {
            DINFO("There is only a single relation! \n"); 
            assert(groupVariableOrder[group].size() == 0);
            assert(destRelation->_bag[0]);
            groupVariableOrder[group].push_back(0);
        }


        groupVariableOrderBitset[group] |= joinVars;
        
        groupViewsPerVarInfo[group].resize(groupVariableOrder[group].size() *
                                       (_qc->numberOfViews() + 2), 0);

        // For each variable, check if the baseRelation contains this variable
        for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
        {
            if (baseRelation->_bag[groupVariableOrder[group][var]])
            {
                size_t idx = var * (_qc->numberOfViews() + 2);
                size_t& off = groupViewsPerVarInfo[group][idx];
                groupViewsPerVarInfo[group][idx+1] = _qc->numberOfViews();
                ++off;
            }
        }

        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
        {
            if (incViewBitset[incViewID])
            {
                groupIncomingViews[group].push_back(incViewID);
                const var_bitset& viewFVars = _qc->getView(incViewID)->_fVars;
                    
                for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
                {
                    if (viewFVars[groupVariableOrder[group][var]])
                    {
                        size_t idx = var * (_qc->numberOfViews() + 2);
                        size_t& off = groupViewsPerVarInfo[group][idx];
                        groupViewsPerVarInfo[group][idx+off+1] = incViewID;
                        ++off;
                    }
                }
            }
        }      
    }

    _requireHashing = new bool[_qc->numberOfViews()]();

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        bool hash = false;
        size_t orderIdx = 0;
        
        var_bitset intersection = view->_fVars & _td->getRelation(view->_origin)->_bag;
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (intersection[var])
            {
                if (sortOrders[view->_origin][orderIdx] != var)
                {
                    hash = true;
                    break;
                }
                ++orderIdx;
            }
        }
        _requireHashing[viewID] = hash || (view->_fVars & ~intersection).any();
    }
}